

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void gimage::anon_unknown_17::loadTiled<unsigned_short>
               (BasicImageIO *io,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,
               char *name,int ds,long x,long y,long w,long h)

{
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this;
  bool bVar1;
  store_t_conflict1 sVar2;
  int iVar3;
  long *plVar4;
  undefined8 uVar5;
  long lVar6;
  string *prefix_00;
  long lVar7;
  float *pfVar8;
  int in_ECX;
  char *in_RDX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  float fVar9;
  long in_stack_00000008;
  long in_stack_00000010;
  int d_3;
  float c_1;
  long i_2;
  long k_2;
  int d_2;
  int d_1;
  float c;
  float cy;
  float cx;
  long yy_1;
  long xx_1;
  long i_1;
  long k_1;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> timage_1;
  string tname_1;
  long ph_1;
  long pw_1;
  long py_1;
  long px_1;
  int tx_1;
  int ty_1;
  valarray<float> count;
  valarray<float> value;
  int ty2_1;
  int tx2_1;
  int ty1_1;
  int tx1_1;
  int d;
  long xx;
  long i;
  long yy;
  long k;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> timage;
  string tname;
  long ph;
  long pw;
  long py;
  long px;
  int tx;
  int ty;
  int ty2;
  int tx2;
  int ty1;
  int tx1;
  int depth;
  long height;
  long width;
  long tborder;
  long cheight;
  long theight;
  long cwidth;
  long twidth;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string suffix;
  string prefix;
  size_t pos;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  valarray<float> *this_01;
  valarray<float> *pvVar10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *pIVar11;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffb88;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffb90;
  long in_stack_fffffffffffffbb8;
  long in_stack_fffffffffffffbc0;
  long *in_stack_fffffffffffffbc8;
  iterator in_stack_fffffffffffffbd0;
  int local_3c8;
  long local_3c0;
  long local_3b8;
  int local_3ac;
  int local_3a8;
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  float local_390;
  float local_38c;
  float local_388;
  float local_384;
  float local_380;
  float local_37c;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  _Self local_358;
  _Self local_350;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> local_348;
  string local_310 [24];
  string *in_stack_fffffffffffffd08;
  long in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  long local_2d8;
  long local_2d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c8;
  long local_2c0 [3];
  long local_2a8 [3];
  int local_290;
  int local_28c;
  valarray<float> local_288;
  valarray<float> local_278;
  int local_268;
  int local_264;
  long local_260 [2];
  int local_24c;
  long local_248 [2];
  int local_238;
  int local_234;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  _Self local_210;
  _Self local_208;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> local_200;
  string local_1c8 [32];
  long local_1a8;
  long local_1a0;
  valarray<float> *local_198;
  long local_190;
  long local_188;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_180;
  long local_178 [3];
  long local_160 [3];
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  long local_138;
  int local_12c;
  long local_128;
  int local_120;
  int local_11c;
  undefined1 local_118 [16];
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  _Base_ptr in_stack_ffffffffffffff18;
  long *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  BasicImageIO *in_stack_ffffffffffffff40;
  long *in_stack_ffffffffffffff50;
  long *in_stack_ffffffffffffff58;
  long *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  string local_90 [32];
  ulong local_70;
  allocator local_51;
  string local_50 [32];
  long local_30;
  long local_28;
  int local_1c;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  long *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RDX,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_70 = std::__cxx11::string::rfind((char)local_50,0x3a);
  if ((local_70 != 0xffffffffffffffff) &&
     (iVar3 = std::__cxx11::string::compare((ulong)local_50,local_70,(char *)0x2), iVar3 == 0)) {
    local_70 = 0xffffffffffffffff;
  }
  std::__cxx11::string::substr((ulong)local_90,(ulong)local_50);
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffff50,(ulong)local_50);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x17412b);
  pIVar11 = (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&local_11c;
  this_02 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118;
  this_01 = (valarray<float> *)(local_118 + 8);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108;
  loadTiledHeader(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                  in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                  (long *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff50,
                  in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  if (in_stack_00000008 < 1) {
    in_stack_00000008 = (local_118._8_8_ + (long)local_1c + -1) / (long)local_1c;
  }
  if (in_stack_00000010 < 1) {
    in_stack_00000010 = (local_118._0_8_ + (long)local_1c + -1) / (long)local_1c;
  }
  local_f0 = (_Base_ptr)((long)in_stack_ffffffffffffff18 + (long)local_108 * -2);
  local_100 = (_Base_ptr)((long)local_f8 + (long)local_108 * -2);
  if ((local_1c == 1) && (local_108 == (_Base_ptr)0x0)) {
    local_128 = 0;
    plVar4 = std::max<long>(&local_128,&local_28);
    local_120 = (int)(*plVar4 / (long)local_f0);
    local_138 = 0;
    plVar4 = std::max<long>(&local_138,&local_30);
    local_12c = (int)(*plVar4 / (long)local_100);
    local_13c = (int)((local_28 + -1 + in_stack_00000008) / (long)local_f0);
    local_140 = (int)((local_30 + -1 + in_stack_00000010) / (long)local_100);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
               in_stack_fffffffffffffbd0._M_node,(long)in_stack_fffffffffffffbc8,
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::clear(in_stack_fffffffffffffb90);
    for (local_144 = local_12c; local_144 <= local_140; local_144 = local_144 + 1) {
      for (local_148 = local_120; local_148 <= local_13c; local_148 = local_148 + 1) {
        local_160[1] = 0;
        local_160[0] = local_28 - (long)local_148 * (long)local_f0;
        plVar4 = std::max<long>(local_160 + 1,local_160);
        local_160[2] = *plVar4;
        local_178[1] = 0;
        local_178[0] = local_30 - (long)local_144 * (long)local_100;
        plVar4 = std::max<long>(local_178 + 1,local_178);
        local_178[2] = *plVar4;
        local_188 = (long)in_stack_ffffffffffffff18 - local_160[2];
        local_190 = ((local_28 + in_stack_00000008) - local_160[2]) -
                    (long)local_148 * (long)local_f0;
        plVar4 = std::min<long>(&local_188,&local_190);
        local_180 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)*plVar4;
        local_1a0 = (long)local_f8 - local_178[2];
        local_1a8 = ((local_30 + in_stack_00000010) - local_178[2]) -
                    (long)local_144 * (long)local_100;
        plVar4 = std::min<long>(&local_1a0,&local_1a8);
        local_198 = (valarray<float> *)*plVar4;
        getTileName(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                    (int)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
                  (pIVar11,(long)this_02,(long)this_01,(int)((ulong)this_00 >> 0x20));
        local_208._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(this_02,(key_type *)this_01);
        local_210._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
        bVar1 = std::operator!=(&local_208,&local_210);
        plVar4 = local_8;
        if (bVar1) {
          uVar5 = std::__cxx11::string::c_str();
          this_00 = local_180;
          this_01 = local_198;
          (**(code **)(*plVar4 + 0x38))(plVar4,&local_200,uVar5,1,local_160[2],local_178[2]);
          for (local_218 = 0; lVar7 = local_218,
              lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight
                                (&local_200), lVar7 < lVar6; local_218 = local_218 + 1) {
            local_220 = ((long)local_144 * (long)local_100 + local_178[2] + local_218) - local_30;
            for (local_228 = 0; lVar7 = local_228,
                lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                  (&local_200), lVar7 < lVar6; local_228 = local_228 + 1) {
              local_230 = ((long)local_148 * (long)local_f0 + local_160[2] + local_228) - local_28;
              for (local_234 = 0; this = local_10, lVar6 = local_220, lVar7 = local_230,
                  iVar3 = local_234, local_234 < local_11c; local_234 = local_234 + 1) {
                sVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                                  (&local_200,local_228,local_218,local_234);
                Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                          (this,lVar7,lVar6,iVar3,sVar2);
              }
            }
          }
        }
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(pIVar11);
        std::__cxx11::string::~string(local_1c8);
      }
    }
  }
  else {
    local_248[1] = 0;
    local_248[0] = local_28 * local_1c - (long)local_108;
    plVar4 = std::max<long>(local_248 + 1,local_248);
    local_238 = (int)(*plVar4 / (long)local_f0);
    local_260[1] = 0;
    local_260[0] = local_30 * local_1c - (long)local_108;
    plVar4 = std::max<long>(local_260 + 1,local_260);
    local_24c = (int)(*plVar4 / (long)local_100);
    local_264 = (int)((long)((long)&local_108->_M_color +
                            (local_28 + -1 + in_stack_00000008) * (long)local_1c) / (long)local_f0);
    local_268 = (int)((long)((long)&local_108->_M_color +
                            (local_30 + -1 + in_stack_00000010) * (long)local_1c) / (long)local_100)
    ;
    std::valarray<float>::valarray(this_01,(size_t)this_00);
    std::valarray<float>::valarray(this_01,(size_t)this_00);
    for (local_28c = local_24c; local_28c <= local_268; local_28c = local_28c + 1) {
      for (local_290 = local_238; local_290 <= local_264; local_290 = local_290 + 1) {
        local_2a8[1] = 0;
        local_2a8[0] = (long)local_108 + (local_28 * local_1c - (long)local_290 * (long)local_f0);
        plVar4 = std::max<long>(local_2a8 + 1,local_2a8);
        local_2a8[2] = *plVar4;
        local_2c0[1] = 0;
        local_2c0[0] = (long)local_108 + (local_30 * local_1c - (long)local_28c * (long)local_100);
        plVar4 = std::max<long>(local_2c0 + 1,local_2c0);
        local_2c0[2] = *plVar4;
        local_2d0 = (long)in_stack_ffffffffffffff18 - local_2a8[2];
        local_2d8 = (long)local_108 +
                    (((local_28 + in_stack_00000008) * (long)local_1c - local_2a8[2]) -
                    (long)local_290 * (long)local_f0);
        plVar4 = std::min<long>(&local_2d0,&local_2d8);
        local_2c8 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)*plVar4;
        prefix_00 = (string *)((long)local_f8 - local_2c0[2]);
        lVar7 = (long)local_108 +
                (((local_30 + in_stack_00000010) * (long)local_1c - local_2c0[2]) -
                (long)local_28c * (long)local_100);
        plVar4 = std::min<long>((long *)&stack0xfffffffffffffd18,(long *)&stack0xfffffffffffffd10);
        pvVar10 = (valarray<float> *)*plVar4;
        getTileName(prefix_00,(int)((ulong)lVar7 >> 0x20),(int)lVar7,in_stack_fffffffffffffd08);
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
                  (pIVar11,(long)this_02,(long)this_01,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffffbd0 =
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(this_02,(key_type *)this_01);
        local_350._M_node = in_stack_fffffffffffffbd0._M_node;
        local_358._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
        bVar1 = std::operator!=(&local_350,&local_358);
        if (bVar1) {
          in_stack_fffffffffffffbc8 = local_8;
          uVar5 = std::__cxx11::string::c_str();
          this_00 = local_2c8;
          (**(code **)(*in_stack_fffffffffffffbc8 + 0x38))
                    (in_stack_fffffffffffffbc8,&local_348,uVar5,1,local_2a8[2],local_2c0[2]);
          local_360 = 0;
          while (in_stack_fffffffffffffbc0 = local_360,
                lVar7 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight
                                  (&local_348), this_01 = pvVar10, in_stack_fffffffffffffbc0 < lVar7
                ) {
            local_368 = 0;
            while (in_stack_fffffffffffffbb8 = local_368,
                  lVar7 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth
                                    (&local_348), in_stack_fffffffffffffbb8 < lVar7) {
              bVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValid
                                (in_stack_fffffffffffffb88,(long)pIVar11,(long)this_02);
              if (bVar1) {
                local_370 = ((((long)local_290 * (long)local_f0 - (long)local_108) + local_2a8[2] +
                             local_368) - local_28 * local_1c) / (long)local_1c;
                local_378 = ((((long)local_28c * (long)local_100 - (long)local_108) + local_2c0[2] +
                             local_360) - local_30 * local_1c) / (long)local_1c;
                if ((long)local_108 < 1) {
                  for (local_3ac = 0; local_3ac < local_11c; local_3ac = local_3ac + 1) {
                    sVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                                      (&local_348,local_368,local_360,local_3ac);
                    pfVar8 = std::valarray<float>::operator[]
                                       (&local_278,
                                        (local_3ac * in_stack_00000010 + local_378) *
                                        in_stack_00000008 + local_370);
                    *pfVar8 = (float)sVar2 + *pfVar8;
                  }
                  pfVar8 = std::valarray<float>::operator[]
                                     (&local_288,local_378 * in_stack_00000008 + local_370);
                  *pfVar8 = *pfVar8 + 1.0;
                }
                else {
                  local_380 = (float)(local_2a8[2] + local_368) / ((float)(long)local_108 * 2.0);
                  local_384 = (float)((long)in_stack_ffffffffffffff18 + (-local_368 - local_2a8[2]))
                              / ((float)(long)local_108 * 2.0);
                  pfVar8 = std::min<float>(&local_380,&local_384);
                  local_37c = *pfVar8;
                  local_38c = (float)(local_2c0[2] + local_360) / ((float)(long)local_108 * 2.0);
                  local_390 = (float)((long)local_f8 + (-local_360 - local_2c0[2])) /
                              ((float)(long)local_108 * 2.0);
                  pfVar8 = std::min<float>(&local_38c,&local_390);
                  local_388 = *pfVar8;
                  local_394 = 1e-06;
                  local_398 = 1.0;
                  pfVar8 = std::min<float>(&local_398,&local_37c);
                  pfVar8 = std::max<float>(&local_394,pfVar8);
                  local_37c = *pfVar8;
                  local_39c = 1e-06;
                  local_3a0 = 1.0;
                  pfVar8 = std::min<float>(&local_3a0,&local_388);
                  pfVar8 = std::max<float>(&local_39c,pfVar8);
                  local_388 = *pfVar8;
                  fVar9 = local_37c * local_388;
                  for (local_3a8 = 0; local_3a8 < local_11c; local_3a8 = local_3a8 + 1) {
                    sVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                                      (&local_348,local_368,local_360,local_3a8);
                    pfVar8 = std::valarray<float>::operator[]
                                       (&local_278,
                                        (local_3a8 * in_stack_00000010 + local_378) *
                                        in_stack_00000008 + local_370);
                    *pfVar8 = fVar9 * (float)sVar2 + *pfVar8;
                  }
                  pfVar8 = std::valarray<float>::operator[]
                                     (&local_288,local_378 * in_stack_00000008 + local_370);
                  *pfVar8 = fVar9 + *pfVar8;
                }
              }
              local_368 = local_368 + 1;
            }
            local_360 = local_360 + 1;
          }
        }
        Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(pIVar11);
        std::__cxx11::string::~string(local_310);
      }
    }
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
               in_stack_fffffffffffffbd0._M_node,(long)in_stack_fffffffffffffbc8,
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::clear(in_stack_fffffffffffffb90);
    for (local_3b8 = 0; local_3b8 < in_stack_00000010; local_3b8 = local_3b8 + 1) {
      for (local_3c0 = 0; local_3c0 < in_stack_00000008; local_3c0 = local_3c0 + 1) {
        pfVar8 = std::valarray<float>::operator[]
                           (&local_288,local_3b8 * in_stack_00000008 + local_3c0);
        fVar9 = *pfVar8;
        if (0.0 < fVar9) {
          for (local_3c8 = 0; local_3c8 < local_11c; local_3c8 = local_3c8 + 1) {
            pIVar11 = local_10;
            lVar7 = local_3c0;
            pfVar8 = std::valarray<float>::operator[]
                               (&local_278,
                                (local_3c8 * in_stack_00000010 + local_3b8) * in_stack_00000008 +
                                local_3c0);
            Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                      (pIVar11,lVar7,local_3b8,local_3c8,(store_t_conflict1)(int)(*pfVar8 / fVar9));
          }
        }
      }
    }
    std::valarray<float>::~valarray(this_01);
    std::valarray<float>::~valarray(this_01);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x175605);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void loadTiled(const BasicImageIO &io, Image<T> &image,
                                 const char *name, int ds, long x, long y, long w, long h)
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  // extract prefix and suffix from file name

  std::string prefix=s.substr(0, pos);
  std::string suffix=s.substr(pos+1);

  // get information about the tiled image

  std::set<std::string> list;
  long twidth, cwidth;
  long theight, cheight;
  long tborder;
  long width;
  long height;
  int  depth;

  loadTiledHeader(io, list, prefix, suffix, twidth, theight, tborder, width,
                  height, depth);

  if (w <= 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h <= 0)
  {
    h=(height+ds-1)/ds;
  }

  cwidth=twidth-2*tborder;
  cheight=theight-2*tborder;

  if (ds == 1 && tborder == 0) // loading without downscaling and overlapping tiles
  {
    // determine block of tiles that is involved

    int tx1=std::max(0l, x)/cwidth;
    int ty1=std::max(0l, y)/cheight;
    int tx2=(x+w-1)/cwidth;
    int ty2=(y+h-1)/cheight;

    // go through all tiles

    image.setSize(w, h, depth);
    image.clear();

    for (int ty=ty1; ty<=ty2; ty++)
    {
      for (int tx=tx1; tx<=tx2; tx++)
      {
        // load part of tile

        long px=std::max(0l, x-tx*cwidth);
        long py=std::max(0l, y-ty*cheight);
        long pw=std::min(twidth-px, x+w-px-tx*cwidth);
        long ph=std::min(theight-py, y+h-py-ty*cheight);

        std::string   tname=getTileName(prefix, ty, tx, suffix);
        Image<T> timage(pw, ph, depth);

        if (list.find(tname) != list.end())
        {
          io.load(timage, tname.c_str(), 1, px, py, pw, ph);

          // copy part of tile with downscaling

          for (long k=0; k<timage.getHeight(); k++)
          {
            const long yy=ty*cheight+py+k-y;

            for (long i=0; i<timage.getWidth(); i++)
            {
              const long xx=tx*cwidth+px+i-x;

              for (int d=0; d<depth; d++)
              {
                image.set(xx, yy, d, timage.get(i, k, d));
              }
            }
          }
        }
      }
    }
  }
  else
  {
    // determine block of tiles that is involved

    int tx1=std::max(0l, x*ds-tborder)/cwidth;
    int ty1=std::max(0l, y*ds-tborder)/cheight;
    int tx2=((x+w-1)*ds+tborder)/cwidth;
    int ty2=((y+h-1)*ds+tborder)/cheight;

    // go through all tiles

    std::valarray<float> value(w*h*depth);
    std::valarray<float> count(w*h);

    for (int ty=ty1; ty<=ty2; ty++)
    {
      for (int tx=tx1; tx<=tx2; tx++)
      {
        // load part of tile

        long px=std::max(0l, x*ds-(tx*cwidth-tborder));
        long py=std::max(0l, y*ds-(ty*cheight-tborder));
        long pw=std::min(twidth-px, (x+w)*ds-px-(tx*cwidth-tborder));
        long ph=std::min(theight-py, (y+h)*ds-py-(ty*cheight-tborder));

        std::string   tname=getTileName(prefix, ty, tx, suffix);
        Image<T> timage(pw, ph, depth);

        if (list.find(tname) != list.end())
        {
          io.load(timage, tname.c_str(), 1, px, py, pw, ph);

          // copy part of tile with downscaling

          for (long k=0; k<timage.getHeight(); k++)
          {
            for (long i=0; i<timage.getWidth(); i++)
            {
              if (timage.isValid(i, k))
              {
                long xx=(tx*cwidth-tborder+px+i-x*ds)/ds;
                long yy=(ty*cheight-tborder+py+k-y*ds)/ds;

                if (tborder > 0)
                {
                  float cx=std::min((px+i)/(2.0f*tborder), (twidth-px-i)/(2.0f*tborder));
                  float cy=std::min((py+k)/(2.0f*tborder), (theight-py-k)/(2.0f*tborder));

                  cx=std::max(1e-6f, std::min(1.0f, cx));
                  cy=std::max(1e-6f, std::min(1.0f, cy));

                  float c=cx*cy;

                  for (int d=0; d<depth; d++)
                  {
                    value[(d*h+yy)*w+xx]+=c*static_cast<float>(timage.get(i, k, d));
                  }

                  count[yy*w+xx]+=c;
                }
                else
                {
                  for (int d=0; d<depth; d++)
                  {
                    value[(d*h+yy)*w+xx]+=static_cast<float>(timage.get(i, k, d));
                  }

                  count[yy*w+xx]++;
                }
              }
            }
          }
        }
      }
    }

    // copy result to target image

    image.setSize(w, h, depth);
    image.clear();

    for (long k=0; k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        float c=count[k*w+i];

        if (c > 0)
        {
          for (int d=0; d<depth; d++)
          {
            image.set(i, k, d, static_cast<typename Image<T>::store_t>(value[(d*h+k)*w+i]/c));
          }
        }
      }
    }
  }
}